

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall
spectest::CommandRunner::ReadInvalidModule
          (CommandRunner *this,int line_number,string_view module_filename,ModuleType module_type,
          char *desc)

{
  Result RVar1;
  CommandRunner *this_00;
  Errors errors;
  string header;
  Ptr module;
  
  this_00 = (CommandRunner *)&header;
  wabt::StringPrintf_abi_cxx11_
            ((string *)this_00,"%s:%d: %s passed",(this->source_filename_)._M_dataplus._M_p,
             line_number,desc);
  if (module_type == Binary) {
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ReadModule(&module,this,module_filename,&errors);
    if (module.obj_ == (Module *)0x0) {
      wabt::FormatErrorsToFile
                (&errors,Binary,(LexerSourceLineFinder *)0x0,_stdout,&header,Once,0x50);
    }
    RVar1.enum_ = (Enum)(module.obj_ == (Module *)0x0);
    wabt::interp::RefPtr<wabt::interp::Module>::reset(&module);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
  }
  else {
    if (module_type != Text) {
      abort();
    }
    RVar1 = ReadInvalidTextModule(this_00,module_filename,&header);
  }
  std::__cxx11::string::_M_dispose();
  return (Result)RVar1.enum_;
}

Assistant:

wabt::Result CommandRunner::ReadInvalidModule(int line_number,
                                        string_view module_filename,
                                        ModuleType module_type,
                                        const char* desc) {
  std::string header = StringPrintf(
      "%s:%d: %s passed", source_filename_.c_str(), line_number, desc);

  switch (module_type) {
    case ModuleType::Text: {
      return ReadInvalidTextModule(module_filename, header);
    }

    case ModuleType::Binary: {
      Errors errors;
      auto module = ReadModule(module_filename, &errors);
      if (!module) {
        FormatErrorsToFile(errors, Location::Type::Binary, {}, stdout, header,
                           PrintHeader::Once);
        return wabt::Result::Error;
      } else {
        return wabt::Result::Ok;
      }
    }
  }

  WABT_UNREACHABLE;
}